

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O3

bool __thiscall
HACD::RMNode::Raycast
          (RMNode *this,Vec3<double> *from,Vec3<double> *dir,long *triID,Float *distance,
          Vec3<double> *hitPoint,Vec3<double> *hitNormal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vec3<long> *pVVar3;
  Vec3<double> *pVVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  SArray<long,_16UL> *pSVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dist;
  Float distToSphere;
  bool local_a4;
  double local_90;
  Vec3<double> *local_88;
  long *local_80;
  long local_78;
  double local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar12 = BBox::Raycast(&this->m_bBox,from,dir,&local_70);
  if ((!bVar12) || (*distance <= local_70)) {
    local_a4 = false;
  }
  else if (this->m_leaf == true) {
    pVVar3 = this->m_rm->m_triangles;
    pVVar4 = this->m_rm->m_vertices;
    local_90 = 0.0;
    if ((this->m_triIDs).m_size == 0) {
      local_a4 = false;
    }
    else {
      uVar15 = 0;
      local_a4 = false;
      local_88 = hitPoint;
      local_80 = triID;
      do {
        pSVar13 = &this->m_triIDs;
        if ((this->m_triIDs).m_maxSize != 0x10) {
          pSVar13 = (SArray<long,_16UL> *)(this->m_triIDs).m_data;
        }
        local_78 = pSVar13->m_data0[uVar15];
        lVar14 = pVVar3[local_78].m_data[2];
        lVar5 = pVVar3[local_78].m_data[0];
        lVar6 = pVVar3[local_78].m_data[1];
        dVar17 = pVVar4[lVar6].m_data[0] - pVVar4[lVar5].m_data[0];
        dVar7 = pVVar4[lVar14].m_data[0] - pVVar4[lVar5].m_data[0];
        dVar8 = pVVar4[lVar6].m_data[1] - pVVar4[lVar5].m_data[1];
        dVar9 = pVVar4[lVar6].m_data[2] - pVVar4[lVar5].m_data[2];
        dVar10 = pVVar4[lVar14].m_data[1] - pVVar4[lVar5].m_data[1];
        dVar11 = pVVar4[lVar14].m_data[2] - pVVar4[lVar5].m_data[2];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar8;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar11;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar10 * dVar9;
        local_48 = vfmsub231sd_fma(auVar27,auVar18,auVar25);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar7;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar9;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar11 * dVar17;
        local_58 = vfmsub231sd_fma(auVar26,auVar21,auVar24);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar17;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar7 * dVar8;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar10;
        local_68 = vfmsub231sd_fma(auVar19,auVar16,auVar23);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = dir->m_data[0];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_58._0_8_ * dir->m_data[1];
        auVar1 = vfmadd231sd_fma(auVar22,local_48,auVar1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dir->m_data[2];
        auVar1 = vfmadd231sd_fma(auVar1,local_68,auVar2);
        if (((0.0 < auVar1._0_8_) &&
            (lVar14 = IntersectRayTriangle
                                (from,dir,pVVar4 + lVar5,pVVar4 + lVar6,pVVar4 + lVar14,&local_90),
            lVar14 == 1)) && (local_90 < *distance)) {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = (double)local_58._0_8_ * (double)local_58._0_8_;
          auVar1 = vfmadd231sd_fma(auVar20,local_48,local_48);
          auVar1 = vfmadd231sd_fma(auVar1,local_68,local_68);
          auVar1 = vsqrtsd_avx(auVar1,auVar1);
          dVar17 = auVar1._0_8_;
          bVar12 = dVar17 != 0.0;
          hitNormal->m_data[0] =
               (double)((ulong)bVar12 * (long)(local_48._0_8_ / dVar17) +
                       (ulong)!bVar12 * (long)local_48._0_8_);
          hitNormal->m_data[1] =
               (double)((ulong)bVar12 * (long)((double)local_58._0_8_ / dVar17) +
                       (ulong)!bVar12 * local_58._0_8_);
          hitNormal->m_data[2] =
               (double)((ulong)bVar12 * (long)(local_68._0_8_ / dVar17) +
                       (ulong)!bVar12 * (long)local_68._0_8_);
          dVar17 = dir->m_data[2];
          dVar8 = dir->m_data[1];
          dVar7 = from->m_data[2];
          dVar9 = from->m_data[1];
          local_88->m_data[0] = local_90 * dir->m_data[0] + from->m_data[0];
          local_88->m_data[1] = local_90 * dVar8 + dVar9;
          local_88->m_data[2] = local_90 * dVar17 + dVar7;
          *distance = local_90;
          *local_80 = local_78;
          local_a4 = true;
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < (this->m_triIDs).m_size);
    }
  }
  else {
    if (this->m_idRight < 0) {
      local_a4 = false;
    }
    else {
      local_a4 = Raycast(this->m_rm->m_nodes + this->m_idRight,from,dir,triID,distance,hitPoint,
                         hitNormal);
    }
    if (this->m_idLeft < 0) {
      bVar12 = false;
    }
    else {
      bVar12 = Raycast(this->m_rm->m_nodes + this->m_idLeft,from,dir,triID,distance,hitPoint,
                       hitNormal);
    }
    local_a4 = (bool)(local_a4 | bVar12);
  }
  return local_a4;
}

Assistant:

bool RMNode::Raycast(const Vec3<Float> & from, const Vec3<Float> & dir, long & triID, Float & distance, Vec3<Real> & hitPoint, Vec3<Real> & hitNormal) const 
	{
		Float distToSphere;
		if (m_bBox.Raycast(from, dir, distToSphere) && (distToSphere < distance))
		{
			if (m_leaf)
			{
				long f, i1, j1, k1;
				Vec3<long> * const triangles = m_rm->m_triangles;			
				Vec3<Float> * const vertices = m_rm->m_vertices;
				Vec3<Real> u1, v1, normal1;
				double dist = 0.0;
				long nhit = 0;
				bool ret = false;
				for(size_t id = 0; id < m_triIDs.Size(); ++id)
				{
					f = m_triIDs[id];
					i1 = triangles[f].X();
					j1 = triangles[f].Y();
					k1 = triangles[f].Z();
					u1 = vertices[j1] - vertices[i1];
					v1 = vertices[k1] - vertices[i1];
					normal1 = (u1 ^ v1);
					if (dir * normal1 > 0.0)
					{
						nhit = IntersectRayTriangle(from, dir, vertices[i1], vertices[j1], vertices[k1], dist);
						if (nhit==1 && distance>dist)
						{
							normal1.Normalize();
							hitNormal = normal1;
							hitPoint = from + dist * dir;
							distance = dist;
							triID = f;
							ret = true;
						}						
					}
				}
				return ret;
			}
			bool ret1 = false;
			bool ret2 = false;
			if (m_idRight >= 0) ret1 = m_rm->m_nodes[m_idRight].Raycast(from, dir, triID, distance, hitPoint, hitNormal);
			if (m_idLeft >= 0)  ret2 = m_rm->m_nodes[m_idLeft].Raycast(from, dir, triID, distance, hitPoint, hitNormal);
			return ret1 || ret2;
		}
		return false;
	}